

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder.cpp
# Opt level: O1

NodeRef __thiscall
embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderV::build
          (BVHNBuilderV *this,FastAllocator *allocator,BuildProgressMonitor *progressFunc,
          PrimRef *prims,PrimInfo *pinfo,Settings settings)

{
  NodeRefPtr<4> NVar1;
  anon_class_8_1_8991fb9c createLeafFunc;
  Heuristic heuristic;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  undefined8 local_18;
  long local_10;
  
  settings.branchingFactor = 4;
  settings.maxDepth = 0x28;
  local_10 = pinfo->end - pinfo->begin;
  local_58 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0;
  uStack_50 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
                       field_0 + 8);
  local_48 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0;
  uStack_40 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
                       field_0 + 8);
  local_38 = *(undefined8 *)
              &(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0;
  uStack_30 = *(undefined8 *)
               ((long)&(pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
                       field_0 + 8);
  local_28 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128[0]
  ;
  fStack_24 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [1];
  fStack_20 = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [2];
  fStack_1c = (pinfo->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.m128
              [3];
  local_18 = 0;
  createLeafFunc.this = this;
  heuristic.prims = prims;
  NVar1 = GeneralBVHBuilder::
          build<embree::NodeRefPtr<4>,embree::sse2::HeuristicArrayBinningSAH<embree::PrimRef,32ul>,embree::sse2::PrimInfoRange,embree::PrimRef,embree::FastAllocator::Create,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Create2,embree::AABBNode_t<embree::NodeRefPtr<4>,4>::Set3,embree::sse2::BVHNBuilderVirtual<4>::BVHNBuilderV::build(embree::FastAllocator*,embree::BuildProgressMonitor&,embree::PrimRef*,embree::PrimInfoT<embree::BBox<embree::Vec3fa>>const&,embree::sse2::GeneralBVHBuilder::Settings)::_lambda(embree::PrimRef_const*,embree::range<unsigned_long>const&,embree::FastAllocator::CachedAllocator_const&)_1_,embree::BuildProgressMonitor>
                    (&heuristic,prims,&local_58,allocator,allocator,prims,&createLeafFunc,
                     progressFunc,&settings);
  return (NodeRef)NVar1.ptr;
}

Assistant:

typename BVHN<N>::NodeRef BVHNBuilderVirtual<N>::BVHNBuilderV::build(FastAllocator* allocator, BuildProgressMonitor& progressFunc, PrimRef* prims, const PrimInfo& pinfo, GeneralBVHBuilder::Settings settings)
    {
      auto createLeafFunc = [&] (const PrimRef* prims, const range<size_t>& set, const Allocator& alloc) -> NodeRef {
        return createLeaf(prims,set,alloc);
      };
      
      settings.branchingFactor = N;
      settings.maxDepth = BVH::maxBuildDepthLeaf;
      return BVHBuilderBinnedSAH::build<NodeRef>
        (FastAllocator::Create(allocator),typename BVH::AABBNode::Create2(),typename BVH::AABBNode::Set3(allocator,prims),createLeafFunc,progressFunc,prims,pinfo,settings);
    }